

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::enforceNotReservedTag(string *tag,SourceLineInfo *_lineInfo)

{
  bool bVar1;
  ostream *poVar2;
  Colour local_2d [8];
  Colour colourGuard_1;
  Colour local_19;
  SourceLineInfo *pSStack_18;
  Colour colourGuard;
  SourceLineInfo *_lineInfo_local;
  string *tag_local;
  
  pSStack_18 = _lineInfo;
  bVar1 = isReservedTag(tag);
  if (!bVar1) {
    return;
  }
  Colour::Colour(&local_19,Red);
  poVar2 = cerr();
  poVar2 = std::operator<<(poVar2,"Tag name [");
  poVar2 = std::operator<<(poVar2,(string *)tag);
  poVar2 = std::operator<<(poVar2,"] not allowed.\n");
  std::operator<<(poVar2,"Tag names starting with non alpha-numeric characters are reserved\n");
  Colour::~Colour(&local_19);
  Colour::Colour(local_2d,FileName);
  poVar2 = cerr();
  poVar2 = operator<<(poVar2,pSStack_18);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Colour::~Colour(local_2d);
  exit(1);
}

Assistant:

inline void enforceNotReservedTag( std::string const& tag, SourceLineInfo const& _lineInfo ) {
        if( isReservedTag( tag ) ) {
            {
                Colour colourGuard( Colour::Red );
                Catch::cerr()
                    << "Tag name [" << tag << "] not allowed.\n"
                    << "Tag names starting with non alpha-numeric characters are reserved\n";
            }
            {
                Colour colourGuard( Colour::FileName );
                Catch::cerr() << _lineInfo << std::endl;
            }
            exit(1);
        }
    }